

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

bool ParseInt64(string_view str,int64_t *out)

{
  undefined1 auVar1 [16];
  byte bVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  string_view str_00;
  optional<long> oVar4;
  string_view local_20;
  long local_10;
  
  pcVar3 = str._M_str;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = str;
  if (str._M_len < 2) {
    if (str._M_len == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pcVar3;
      str_00 = (string_view)(auVar1 << 0x40);
    }
    else {
      if (*pcVar3 == '+') goto LAB_00b08729;
      str_00._M_str = pcVar3;
      str_00._M_len = 1;
    }
  }
  else {
    str_00 = str;
    if (*pcVar3 == '+') {
      if (pcVar3[1] == '-') {
        bVar2 = 0;
        goto LAB_00b08760;
      }
LAB_00b08729:
      str_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_20,1,0xffffffffffffffff);
    }
  }
  oVar4 = ToIntegral<long>(str_00);
  bVar2 = oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
          ._M_engaged;
  if ((out != (int64_t *)0x0) &&
     (((undefined1  [16])
       oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    *out = oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    bVar2 = 1;
  }
LAB_00b08760:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ParseInt64(std::string_view str, int64_t* out)
{
    return ParseIntegral<int64_t>(str, out);
}